

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_util.cpp
# Opt level: O3

idx_t duckdb::ArrowUtil::FetchChunk
                (ChunkScanState *scan_state,ClientProperties *options,idx_t chunk_size,
                ArrowArray *out,
                unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                *extension_type_cast)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  idx_t result_count;
  __alloc_node_gen_t __alloc_node_gen;
  ErrorData error;
  idx_t local_140;
  ClientProperties local_138;
  undefined1 local_108 [32];
  undefined1 local_e8 [128];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  ErrorData::ErrorData((ErrorData *)local_e8);
  paVar2 = &local_138.time_zone.field_2;
  local_138.time_zone._M_dataplus._M_p = (options->time_zone)._M_dataplus._M_p;
  paVar1 = &(options->time_zone).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.time_zone._M_dataplus._M_p == paVar1) {
    local_138.time_zone.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_138.time_zone.field_2._8_8_ = *(undefined8 *)((long)&(options->time_zone).field_2 + 8);
    local_138.time_zone._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_138.time_zone.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_138.time_zone._M_string_length = (options->time_zone)._M_string_length;
  (options->time_zone)._M_dataplus._M_p = (pointer)paVar1;
  (options->time_zone)._M_string_length = 0;
  (options->time_zone).field_2._M_local_buf[0] = '\0';
  local_138.arrow_offset_size = options->arrow_offset_size;
  local_138.arrow_use_list_view = options->arrow_use_list_view;
  local_138.produce_arrow_string_view = options->produce_arrow_string_view;
  local_138.arrow_lossless_conversion = options->arrow_lossless_conversion;
  local_138._36_4_ = *(undefined4 *)&options->field_0x24;
  local_138.client_context.ptr = (options->client_context).ptr;
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count = (extension_type_cast->_M_h)._M_bucket_count;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = (extension_type_cast->_M_h)._M_element_count;
  local_68._M_rehash_policy._M_max_load_factor =
       (extension_type_cast->_M_h)._M_rehash_policy._M_max_load_factor;
  local_68._M_rehash_policy._4_4_ =
       *(undefined4 *)&(extension_type_cast->_M_h)._M_rehash_policy.field_0x4;
  local_68._M_rehash_policy._M_next_resize =
       (extension_type_cast->_M_h)._M_rehash_policy._M_next_resize;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_108._0_8_ = &local_68;
  ::std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,false>>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_68,&extension_type_cast->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_false>_>_>
              *)local_108);
  bVar3 = TryFetchChunk(scan_state,&local_138,chunk_size,out,&local_140,(ErrorData *)local_e8,
                        (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                         *)&local_68);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.time_zone._M_dataplus._M_p != paVar2) {
    operator_delete(local_138.time_zone._M_dataplus._M_p);
  }
  if (bVar3) {
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_e8 + 0x48));
    if ((undefined1 *)local_e8._40_8_ != local_e8 + 0x38) {
      operator_delete((void *)local_e8._40_8_);
    }
    if ((undefined1 *)local_e8._8_8_ != local_e8 + 0x18) {
      operator_delete((void *)local_e8._8_8_);
    }
    return local_140;
  }
  local_108._0_8_ = local_108 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_108,anon_var_dwarf_643837b + 9);
  ErrorData::Throw((ErrorData *)local_e8,(string *)local_108);
}

Assistant:

idx_t ArrowUtil::FetchChunk(ChunkScanState &scan_state, ClientProperties options, idx_t chunk_size, ArrowArray *out,
                            const unordered_map<idx_t, const shared_ptr<ArrowTypeExtensionData>> &extension_type_cast) {
	ErrorData error;
	idx_t result_count;
	if (!TryFetchChunk(scan_state, std::move(options), chunk_size, out, result_count, error, extension_type_cast)) {
		error.Throw();
	}
	return result_count;
}